

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O0

void __thiscall BufferIndex<double,_long>::index_size(BufferIndex<double,_long> *this)

{
  size_type sVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  tree_stats *ptVar4;
  pointer pvVar5;
  ostream *poVar6;
  long lVar7;
  long in_RDI;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  const_iterator it;
  size_t data_size;
  size_t slot_size;
  size_t model_size;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *this_00;
  leaf_node *in_stack_ffffffffffffff80;
  const_iterator *in_stack_ffffffffffffff90;
  self local_60;
  const_iterator local_40;
  size_t local_20;
  size_t local_18;
  size_t local_10 [2];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_10[0] = 0;
  local_18 = 0;
  local_20 = 0;
  ptVar4 = stx::
           btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
           ::get_stats((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                        *)(in_RDI + 0x10));
  sVar1 = ptVar4->innernodes;
  stx::
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  ::get_stats((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
               *)(in_RDI + 0x10));
  ptVar4 = stx::
           btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
           ::get_stats((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                        *)(in_RDI + 0x10));
  this_00 = (btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
             *)ptVar4->leaves;
  stx::
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  ::get_stats((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
               *)(in_RDI + 0x10));
  lVar7 = (long)this_00 * 0x10;
  ptVar4 = stx::
           btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
           ::get_stats((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                        *)(in_RDI + 0x10));
  local_10[0] = (sVar1 * 0x10 + lVar7) * 0x10 + 0x58 + ptVar4->leaves * 0x10 + local_10[0];
  local_18 = local_18 + 0x10000;
  local_20 = (*(long *)(in_RDI + 0x48) + *(long *)(in_RDI + 0x8050)) * 0x10 + local_20;
  stx::
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  ::begin(this_00);
  while( true ) {
    stx::
    btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
    ::end((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
           *)in_stack_ffffffffffffff80);
    bVar3 = stx::
            btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
            ::const_iterator::operator!=(&local_40,&local_60);
    auVar8 = in_ZMM0._0_16_;
    if (!bVar3) break;
    pvVar5 = stx::
             btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
             ::const_iterator::operator->(in_stack_ffffffffffffff90);
    BufferNode<double,_long>::node_size(pvVar5->second,local_10,&local_18,&local_20);
    stx::
    btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
    ::const_iterator::operator++((self *)&stack0xffffffffffffff80,&local_40,0);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Total size: ");
  auVar8 = vcvtusi2sd_avx512f(auVar8,local_10[0] + local_18);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,auVar8._0_8_ / 1048576.0);
  poVar6 = std::operator<<(poVar6," MB");
  auVar9._0_8_ = std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  auVar9._8_56_ = extraout_var;
  auVar8 = auVar9._0_16_;
  poVar6 = std::operator<<((ostream *)&std::cout,"Model size: ");
  auVar8 = vcvtusi2sd_avx512f(auVar8,local_10[0]);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,auVar8._0_8_ / 1048576.0);
  poVar6 = std::operator<<(poVar6," MB");
  auVar10._0_8_ = std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  auVar10._8_56_ = extraout_var_00;
  auVar8 = auVar10._0_16_;
  poVar6 = std::operator<<((ostream *)&std::cout,"Fill rate: ");
  auVar8 = vcvtusi2sd_avx512f(auVar8,local_20);
  auVar2 = vcvtusi2sd_avx512f(auVar8,local_18);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(auVar8._0_8_ * 100.0) / auVar2._0_8_);
  poVar6 = std::operator<<(poVar6,"%");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void index_size() const {
        size_t model_size = 0;
        size_t slot_size = 0;
        size_t data_size = 0;
        model_size += sizeof(*this) - 2 * RESERVE * (sizeof(K) + sizeof(P)) + (btree.get_stats().innernodes * btree.get_stats().innerslots + btree.get_stats().leaves * btree.get_stats().leafslots) * (sizeof(K) + sizeof(void*)) + btree.get_stats().leaves * sizeof(void*) * 2;
        slot_size += 2 * RESERVE * (sizeof(K) + sizeof(P));
        data_size += (left_buffer.number + right_buffer.number) * (sizeof(K) + sizeof(P));
        auto it = btree.begin();
        while (it != btree.end()) {
            it->second->node_size(model_size, slot_size, data_size);
            it++;
        }

        std::cout << "Total size: " << (double)(model_size+slot_size)/(1024*1024) << " MB" << std::endl;
        std::cout << "Model size: " << (double)model_size/(1024*1024) << " MB" << std::endl;
        std::cout << "Fill rate: " << (double)100*data_size/slot_size << "%" << std::endl;
    }